

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool createNativeWindow(_GLFWwindow *window,_GLFWwndconfig *wndconfig,Visual *visual,int depth)

{
  GLFWbool GVar1;
  __pid_t _Var2;
  undefined8 uVar3;
  _GLFWwindow *window_00;
  size_t sVar4;
  long lVar5;
  undefined4 in_ECX;
  int iVar6;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  unsigned_long filter;
  Atom version;
  char *resourceName;
  XClassHint *hint;
  XWMHints *hints;
  Atom type;
  long pid;
  Atom protocols [2];
  int count;
  Atom states [3];
  XSetWindowAttributes wa;
  int height;
  int width;
  char *in_stack_000002b8;
  int in_stack_000002c4;
  undefined8 in_stack_fffffffffffffeb8;
  uint uVar8;
  undefined1 *puVar7;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 uVar10;
  undefined8 uVar9;
  _GLFWwindow *window_01;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int *ypos;
  int *xpos;
  _GLFWwindow *window_02;
  GLFWbool in_stack_fffffffffffffeec;
  _GLFWwindow *in_stack_fffffffffffffef0;
  ulong uVar11;
  undefined8 local_108;
  char *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  char *in_stack_ffffffffffffff18;
  Atom local_d8;
  Atom local_d0;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  int *in_stack_ffffffffffffff48;
  _GLFWwindow *in_stack_ffffffffffffff50;
  undefined1 local_a0 [136];
  int *local_18;
  long local_10;
  GLFWbool local_4;
  
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  uVar8 = (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_a0._120_4_ = *in_RSI;
  local_a0._116_4_ = in_RSI[1];
  if (in_RSI[0xd] != 0) {
    local_a0._120_4_ = (undefined4)((float)(int)local_a0._120_4_ * _glfw.x11.contentScaleX);
    local_a0._116_4_ = (undefined4)((float)(int)local_a0._116_4_ * _glfw.x11.contentScaleY);
  }
  local_a0._124_4_ = in_ECX;
  local_a0._128_8_ = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar3 = XCreateColormap(_glfw.x11.display,_glfw.x11.root,in_RDX,0);
  *(undefined8 *)(local_10 + 0x340) = uVar3;
  GVar1 = _glfwIsVisualTransparentX11
                    ((Visual *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  *(GLFWbool *)(local_10 + 0x36c) = GVar1;
  memset(local_a0,0,0x70);
  local_a0._96_8_ = *(undefined8 *)(local_10 + 0x340);
  local_a0._72_8_ = (_GLFWcursor *)0x63807f;
  _glfwGrabErrorHandlerX11();
  *(Window *)(local_10 + 0x350) = _glfw.x11.root;
  window_02 = (_GLFWwindow *)local_a0;
  uVar9 = CONCAT44(uVar10,local_a0._124_4_);
  xpos = (int *)0x2808;
  uVar3 = XCreateWindow(_glfw.x11.display,_glfw.x11.root,0,0,local_a0._120_4_,local_a0._116_4_,
                        (ulong)uVar8 << 0x20,uVar9,1);
  uVar10 = (undefined4)((ulong)uVar9 >> 0x20);
  *(undefined8 *)(local_10 + 0x348) = uVar3;
  _glfwReleaseErrorHandlerX11();
  if (*(long *)(local_10 + 0x348) == 0) {
    _glfwInputErrorX11(in_stack_000002c4,in_stack_000002b8);
    local_4 = 0;
  }
  else {
    XSaveContext(_glfw.x11.display,*(undefined8 *)(local_10 + 0x348),_glfw.x11.context,local_10);
    ypos = (int *)local_a0._128_8_;
    if (local_18[6] == 0) {
      _glfwPlatformSetWindowDecorated(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      ypos = (int *)local_a0._128_8_;
    }
    if ((_glfw.x11.NET_WM_STATE != 0) && (*(long *)(local_10 + 0x40) == 0)) {
      in_stack_ffffffffffffff44 = 0;
      if (local_18[9] != 0) {
        if (_glfw.x11.NET_WM_STATE_ABOVE != 0) {
          in_stack_ffffffffffffff48 = (int *)_glfw.x11.NET_WM_STATE_ABOVE;
        }
        in_stack_ffffffffffffff44 = (uint)(_glfw.x11.NET_WM_STATE_ABOVE != 0);
      }
      if (((local_18[10] != 0) && (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0)) &&
         (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0)) {
        iVar6 = in_stack_ffffffffffffff44 + 1;
        *(Atom *)(local_a0 + (long)(int)in_stack_ffffffffffffff44 * 8 + -0x18) =
             _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + 2;
        *(Atom *)(local_a0 + (long)iVar6 * 8 + -0x18) = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        *(undefined4 *)(local_10 + 0x368) = 1;
      }
      if (in_stack_ffffffffffffff44 != 0) {
        uVar3 = CONCAT44(uVar10,in_stack_ffffffffffffff44);
        XChangeProperty(_glfw.x11.display,*(undefined8 *)(local_10 + 0x348),_glfw.x11.NET_WM_STATE,4
                        ,0x20,0,&stack0xffffffffffffff48,uVar3);
        uVar10 = (undefined4)((ulong)uVar3 >> 0x20);
      }
    }
    local_d8 = _glfw.x11.WM_DELETE_WINDOW;
    local_d0 = _glfw.x11.NET_WM_PING;
    XSetWMProtocols(_glfw.x11.display,*(undefined8 *)(local_10 + 0x348),&local_d8,2);
    _Var2 = getpid();
    window_00 = (_GLFWwindow *)(long)_Var2;
    puVar7 = &stack0xffffffffffffff20;
    window_01 = (_GLFWwindow *)CONCAT44(uVar10,1);
    XChangeProperty(_glfw.x11.display,*(undefined8 *)(local_10 + 0x348),_glfw.x11.NET_WM_PID,6,0x20,
                    0);
    if ((_glfw.x11.NET_WM_WINDOW_TYPE != 0) && (_glfw.x11.NET_WM_WINDOW_TYPE_NORMAL != 0)) {
      puVar7 = &stack0xffffffffffffff18;
      window_01 = (_GLFWwindow *)CONCAT44((int)((ulong)window_01 >> 0x20),1);
      in_stack_ffffffffffffff18 = (char *)_glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
      XChangeProperty(_glfw.x11.display,*(undefined8 *)(local_10 + 0x348),
                      _glfw.x11.NET_WM_WINDOW_TYPE,4,0x20,0);
    }
    local_f0 = (undefined8 *)XAllocWMHints();
    if (local_f0 == (undefined8 *)0x0) {
      _glfwInputError(0x10005,"X11: Failed to allocate WM hints");
      local_4 = 0;
    }
    else {
      *local_f0 = 2;
      *(undefined4 *)((long)local_f0 + 0xc) = 1;
      XSetWMHints(_glfw.x11.display,*(undefined8 *)(local_10 + 0x348),local_f0);
      XFree(local_f0);
      updateNormalHints(window_01,(int)((ulong)puVar7 >> 0x20),(int)puVar7);
      uVar10 = (undefined4)((ulong)window_01 >> 0x20);
      local_f8 = (undefined8 *)XAllocClassHint();
      sVar4 = strlen((char *)(local_18 + 0x8f));
      if ((sVar4 == 0) || (sVar4 = strlen((char *)(local_18 + 0x4f)), sVar4 == 0)) {
        local_100 = getenv("RESOURCE_NAME");
        if ((local_100 == (char *)0x0) || (sVar4 = strlen(local_100), sVar4 == 0)) {
          sVar4 = strlen(*(char **)(local_18 + 2));
          if (sVar4 == 0) {
            *local_f8 = "glfw-application";
          }
          else {
            *local_f8 = *(undefined8 *)(local_18 + 2);
          }
        }
        else {
          *local_f8 = local_100;
        }
        sVar4 = strlen(*(char **)(local_18 + 2));
        if (sVar4 == 0) {
          local_f8[1] = "GLFW-Application";
        }
        else {
          local_f8[1] = *(undefined8 *)(local_18 + 2);
        }
      }
      else {
        *local_f8 = local_18 + 0x8f;
        local_f8[1] = local_18 + 0x4f;
      }
      XSetClassHint(_glfw.x11.display,*(undefined8 *)(local_10 + 0x348),local_f8);
      XFree(local_f8);
      local_108 = 5;
      XChangeProperty(_glfw.x11.display,*(undefined8 *)(local_10 + 0x348),_glfw.x11.XdndAware,4,0x20
                      ,0,&local_108,CONCAT44(uVar10,1));
      _glfwPlatformSetWindowTitle(window_00,in_stack_ffffffffffffff18);
      if (_glfw.x11.im != (XIM)0x0) {
        uVar3 = XCreateIC(_glfw.x11.im,"inputStyle",0x408,"clientWindow",
                          *(undefined8 *)(local_10 + 0x348),"focusWindow",
                          *(undefined8 *)(local_10 + 0x348),0);
        *(undefined8 *)(local_10 + 0x358) = uVar3;
      }
      if (*(long *)(local_10 + 0x358) != 0) {
        uVar11 = 0;
        lVar5 = XGetICValues(*(undefined8 *)(local_10 + 0x358),"filterEvents",
                             &stack0xfffffffffffffef0,0);
        if (lVar5 == 0) {
          XSelectInput(_glfw.x11.display,*(undefined8 *)(local_10 + 0x348),local_a0._72_8_ | uVar11)
          ;
        }
      }
      _glfwPlatformGetWindowPos(window_02,xpos,ypos);
      _glfwPlatformGetWindowSize
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static GLFWbool createNativeWindow(_GLFWwindow* window,
                                   const _GLFWwndconfig* wndconfig,
                                   Visual* visual, int depth)
{
    int width = wndconfig->width;
    int height = wndconfig->height;

    if (wndconfig->scaleToMonitor)
    {
        width *= _glfw.x11.contentScaleX;
        height *= _glfw.x11.contentScaleY;
    }

    // Create a colormap based on the visual used by the current context
    window->x11.colormap = XCreateColormap(_glfw.x11.display,
                                           _glfw.x11.root,
                                           visual,
                                           AllocNone);

    window->x11.transparent = _glfwIsVisualTransparentX11(visual);

    XSetWindowAttributes wa = { 0 };
    wa.colormap = window->x11.colormap;
    wa.event_mask = StructureNotifyMask | KeyPressMask | KeyReleaseMask |
                    PointerMotionMask | ButtonPressMask | ButtonReleaseMask |
                    ExposureMask | FocusChangeMask | VisibilityChangeMask |
                    EnterWindowMask | LeaveWindowMask | PropertyChangeMask;

    _glfwGrabErrorHandlerX11();

    window->x11.parent = _glfw.x11.root;
    window->x11.handle = XCreateWindow(_glfw.x11.display,
                                       _glfw.x11.root,
                                       0, 0,   // Position
                                       width, height,
                                       0,      // Border width
                                       depth,  // Color depth
                                       InputOutput,
                                       visual,
                                       CWBorderPixel | CWColormap | CWEventMask,
                                       &wa);

    _glfwReleaseErrorHandlerX11();

    if (!window->x11.handle)
    {
        _glfwInputErrorX11(GLFW_PLATFORM_ERROR,
                           "X11: Failed to create window");
        return GLFW_FALSE;
    }

    XSaveContext(_glfw.x11.display,
                 window->x11.handle,
                 _glfw.x11.context,
                 (XPointer) window);

    if (!wndconfig->decorated)
        _glfwPlatformSetWindowDecorated(window, GLFW_FALSE);

    if (_glfw.x11.NET_WM_STATE && !window->monitor)
    {
        Atom states[3];
        int count = 0;

        if (wndconfig->floating)
        {
            if (_glfw.x11.NET_WM_STATE_ABOVE)
                states[count++] = _glfw.x11.NET_WM_STATE_ABOVE;
        }

        if (wndconfig->maximized)
        {
            if (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT &&
                _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ)
            {
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
                window->x11.maximized = GLFW_TRUE;
            }
        }

        if (count)
        {
            XChangeProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_STATE, XA_ATOM, 32,
                            PropModeReplace, (unsigned char*) states, count);
        }
    }

    // Declare the WM protocols supported by GLFW
    {
        Atom protocols[] =
        {
            _glfw.x11.WM_DELETE_WINDOW,
            _glfw.x11.NET_WM_PING
        };

        XSetWMProtocols(_glfw.x11.display, window->x11.handle,
                        protocols, sizeof(protocols) / sizeof(Atom));
    }

    // Declare our PID
    {
        const long pid = getpid();

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_PID, XA_CARDINAL, 32,
                        PropModeReplace,
                        (unsigned char*) &pid, 1);
    }

    if (_glfw.x11.NET_WM_WINDOW_TYPE && _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL)
    {
        Atom type = _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_WINDOW_TYPE, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &type, 1);
    }

    // Set ICCCM WM_HINTS property
    {
        XWMHints* hints = XAllocWMHints();
        if (!hints)
        {
            _glfwInputError(GLFW_OUT_OF_MEMORY,
                            "X11: Failed to allocate WM hints");
            return GLFW_FALSE;
        }

        hints->flags = StateHint;
        hints->initial_state = NormalState;

        XSetWMHints(_glfw.x11.display, window->x11.handle, hints);
        XFree(hints);
    }

    updateNormalHints(window, width, height);

    // Set ICCCM WM_CLASS property
    {
        XClassHint* hint = XAllocClassHint();

        if (strlen(wndconfig->x11.instanceName) &&
            strlen(wndconfig->x11.className))
        {
            hint->res_name = (char*) wndconfig->x11.instanceName;
            hint->res_class = (char*) wndconfig->x11.className;
        }
        else
        {
            const char* resourceName = getenv("RESOURCE_NAME");
            if (resourceName && strlen(resourceName))
                hint->res_name = (char*) resourceName;
            else if (strlen(wndconfig->title))
                hint->res_name = (char*) wndconfig->title;
            else
                hint->res_name = (char*) "glfw-application";

            if (strlen(wndconfig->title))
                hint->res_class = (char*) wndconfig->title;
            else
                hint->res_class = (char*) "GLFW-Application";
        }

        XSetClassHint(_glfw.x11.display, window->x11.handle, hint);
        XFree(hint);
    }

    // Announce support for Xdnd (drag and drop)
    {
        const Atom version = _GLFW_XDND_VERSION;
        XChangeProperty(_glfw.x11.display, window->x11.handle,
                        _glfw.x11.XdndAware, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &version, 1);
    }

    _glfwPlatformSetWindowTitle(window, wndconfig->title);

    if (_glfw.x11.im)
    {
        window->x11.ic = XCreateIC(_glfw.x11.im,
                                   XNInputStyle,
                                   XIMPreeditNothing | XIMStatusNothing,
                                   XNClientWindow,
                                   window->x11.handle,
                                   XNFocusWindow,
                                   window->x11.handle,
                                   NULL);
    }

    if (window->x11.ic)
    {
        unsigned long filter = 0;
        if (XGetICValues(window->x11.ic, XNFilterEvents, &filter, NULL) == NULL)
            XSelectInput(_glfw.x11.display, window->x11.handle, wa.event_mask | filter);
    }

    _glfwPlatformGetWindowPos(window, &window->x11.xpos, &window->x11.ypos);
    _glfwPlatformGetWindowSize(window, &window->x11.width, &window->x11.height);

    return GLFW_TRUE;
}